

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScenePrivate::addView(QGraphicsScenePrivate *this,QGraphicsView *view)

{
  ulong uVar1;
  QWidget *this_00;
  Data *pDVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QGraphicsView *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = view;
  QtPrivate::QPodArrayOps<QGraphicsView*>::emplace<QGraphicsView*&>
            ((QPodArrayOps<QGraphicsView*> *)&this->views,(this->views).d.size,&local_28);
  QList<QGraphicsView_*>::end(&this->views);
  pDVar2 = (this->grabbedGestures).d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
    uVar3 = 0;
LAB_0060dc79:
    if (uVar3 == 0 && pDVar2 == (Data *)0x0) goto LAB_0060dcff;
  }
  else {
    if (pDVar2->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (pDVar2->numBuckets == uVar3) {
          pDVar2 = (Data *)0x0;
          uVar3 = 0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_0060dc79;
    }
    uVar3 = 0;
  }
  do {
    this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)view);
    QWidget::grabGesture
              (this_00,*(GestureType *)
                        pDVar2->spans[uVar3 >> 7].entries
                        [pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data,
               (GestureFlags)0x0);
    do {
      if (pDVar2->numBuckets - 1 == uVar3) {
        uVar3 = 0;
        pDVar2 = (Data *)0x0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while ((uVar3 != 0) || (pDVar2 != (Data *)0x0));
LAB_0060dcff:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::addView(QGraphicsView *view)
{
    views << view;
#ifndef QT_NO_GESTURES
    for (auto it = grabbedGestures.constBegin();
              it != grabbedGestures.constEnd(); ++it)
        view->viewport()->grabGesture(it.key());
#endif
}